

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.c
# Opt level: O0

SchemeObject * SubProcedure(SchemeObject *arguments)

{
  char cVar1;
  SchemeObject *pSVar2;
  double local_28;
  double result_1;
  long result;
  SchemeObject *arguments_local;
  
  pSVar2 = Car(arguments);
  cVar1 = IsFixnum(pSVar2);
  result = (long)arguments;
  if (cVar1 == '\0') {
    pSVar2 = Car(arguments);
    local_28 = *(double *)&pSVar2->data;
    while( true ) {
      result = (long)Cdr((SchemeObject *)result);
      cVar1 = IsTheEmptyList((SchemeObject *)result);
      if (cVar1 != '\0') break;
      pSVar2 = Car((SchemeObject *)result);
      local_28 = local_28 - *(double *)&pSVar2->data;
    }
    arguments_local = MakeFloatnum(local_28);
  }
  else {
    pSVar2 = Car(arguments);
    result_1 = (double)(pSVar2->data).symbol.value;
    while( true ) {
      result = (long)Cdr((SchemeObject *)result);
      cVar1 = IsTheEmptyList((SchemeObject *)result);
      if (cVar1 != '\0') break;
      pSVar2 = Car((SchemeObject *)result);
      result_1 = (double)((long)result_1 - (long)(pSVar2->data).pair.car);
    }
    arguments_local = MakeFixnum((long)result_1);
  }
  return arguments_local;
}

Assistant:

static SchemeObject*
SubProcedure(SchemeObject* arguments) /* (- ...) */
{
    if (IsFixnum(Car(arguments))) {
        long result = (Car(arguments))->data.fixnum.value;

        while (!IsTheEmptyList(arguments = Cdr(arguments))) {
            result -= (Car(arguments))->data.fixnum.value;
        }
        return MakeFixnum(result);
    } else {
        double result = (Car(arguments))->data.floatnum.value;

            while (!IsTheEmptyList(arguments = Cdr(arguments))) {
                result -= (Car(arguments))->data.floatnum.value;
            }
        return MakeFloatnum(result);
    }
}